

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  value_type vVar1;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  __last;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __last_00;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  __first;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __first_00;
  const_iterator __position;
  const_iterator __position_00;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  float *pfVar5;
  vector<float,_std::allocator<float>_> *pvVar6;
  reference pvVar7;
  reference this_00;
  reference pvVar8;
  reference pvVar9;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  double dVar10;
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> *box_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float confidence;
  float score;
  int q;
  float class_score;
  int class_index;
  float box_score;
  int j;
  int i;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int biases_index;
  int p;
  int pp;
  int net_h;
  int net_w;
  size_t mask_offset;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blobs;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_box_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_box_bbox_rects;
  size_t b;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb08;
  Mat *in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb20;
  Mat *in_stack_fffffffffffffb28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar11;
  Mat *in_stack_fffffffffffffb30;
  float in_stack_fffffffffffffb50;
  float in_stack_fffffffffffffb54;
  float in_stack_fffffffffffffb58;
  float in_stack_fffffffffffffb5c;
  float in_stack_fffffffffffffb60;
  float in_stack_fffffffffffffb64;
  float in_stack_fffffffffffffb68;
  float in_stack_fffffffffffffb6c;
  float *in_stack_fffffffffffffbb0;
  float nms_threshold;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffbb8;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *in_stack_fffffffffffffbc0;
  int local_3fc;
  vector<float,_std::allocator<float>_> *local_3e0;
  vector<float,_std::allocator<float>_> local_3d8;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_3c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3a8;
  float *local_390;
  float *local_388;
  float *local_380;
  float *local_378;
  BBoxRect *local_368;
  BBoxRect *local_360;
  BBoxRect *local_358;
  BBoxRect *local_350;
  reference local_340;
  reference local_338;
  int local_32c;
  float local_328;
  float local_324;
  float local_320;
  float local_31c;
  int local_318;
  float local_314;
  float local_310;
  float local_30c;
  float local_308;
  float local_304;
  float local_300;
  float local_2fc;
  float local_2f8;
  float local_2f4;
  Mat local_2f0;
  float local_2ac;
  int local_2a8;
  float local_2a4;
  int local_2a0;
  float local_29c;
  int local_298;
  int local_294;
  Mat local_250;
  float *local_210;
  Mat local_208;
  float *local_1c8;
  Mat local_1c0;
  float *local_180;
  Mat local_178;
  float *local_138;
  Mat local_130;
  float *local_f0;
  float local_e4;
  float local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  long local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  const_reference local_a8;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_90;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_78;
  ulong local_60;
  undefined1 local_58 [56];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x1ae6e4);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1ae6f1);
  local_60 = 0;
  while( true ) {
    uVar2 = local_60;
    sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
    nms_threshold = (float)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
    if (sVar4 <= uVar2) break;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)0x1ae743);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x1ae750);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)in_stack_fffffffffffffb30,(size_type)in_stack_fffffffffffffb28);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_fffffffffffffb30,(size_type)in_stack_fffffffffffffb28);
    local_a8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_60);
    local_ac = local_a8->w;
    local_b0 = local_a8->h;
    local_b4 = local_a8->c;
    local_b8 = local_b4 / *(int *)(in_RDI + 0xbc);
    if (local_b8 == *(int *)(in_RDI + 0xb8) + 5) {
      local_c8 = local_60 * (long)*(int *)(in_RDI + 0xbc);
      pfVar5 = Mat::operator[]((Mat *)(in_RDI + 0x148),local_60);
      local_cc = (int)(*pfVar5 * (float)local_ac);
      in_stack_fffffffffffffbc0 =
           (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
           Mat::operator[]((Mat *)(in_RDI + 0x148),local_60);
      local_d0 = (int)(*(float *)&(in_stack_fffffffffffffbc0->
                                  super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                  )._M_impl.super__Vector_impl_data._M_start * (float)local_b0);
      for (local_d4 = 0; local_d4 < *(int *)(in_RDI + 0xbc); local_d4 = local_d4 + 1) {
        local_d8 = local_d4 * local_b8;
        in_stack_fffffffffffffbb8 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             Mat::operator[]((Mat *)(in_RDI + 0x108),local_d4 + local_c8);
        local_dc = (int)*(float *)&(in_stack_fffffffffffffbb8->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
        in_stack_fffffffffffffbb0 = Mat::operator[]((Mat *)(in_RDI + 200),(long)(local_dc * 2));
        local_e0 = *in_stack_fffffffffffffbb0;
        pfVar5 = Mat::operator[]((Mat *)(in_RDI + 200),(long)(local_dc * 2 + 1));
        local_e4 = *pfVar5;
        Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                     (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        pfVar5 = Mat::operator_cast_to_float_(&local_130);
        Mat::~Mat((Mat *)0x1aea39);
        local_f0 = pfVar5;
        Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                     (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        pfVar5 = Mat::operator_cast_to_float_(&local_178);
        Mat::~Mat((Mat *)0x1aea8d);
        local_138 = pfVar5;
        Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                     (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        pfVar5 = Mat::operator_cast_to_float_(&local_1c0);
        Mat::~Mat((Mat *)0x1aeae2);
        local_180 = pfVar5;
        Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                     (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        pfVar5 = Mat::operator_cast_to_float_(&local_208);
        Mat::~Mat((Mat *)0x1aeb37);
        local_1c8 = pfVar5;
        Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                     (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        pfVar5 = Mat::operator_cast_to_float_(&local_250);
        Mat::~Mat((Mat *)0x1aeb89);
        local_210 = pfVar5;
        Mat::channel_range(in_stack_fffffffffffffb28,(int)((ulong)in_stack_fffffffffffffb20 >> 0x20)
                           ,(int)in_stack_fffffffffffffb20);
        for (local_294 = 0; local_294 < local_b0; local_294 = local_294 + 1) {
          for (local_298 = 0; local_298 < local_ac; local_298 = local_298 + 1) {
            local_29c = sigmoid(0.0);
            local_2a0 = 0;
            local_2a4 = std::numeric_limits<float>::max();
            local_2a4 = -local_2a4;
            for (local_2a8 = 0; local_2a8 < *(int *)(in_RDI + 0xb8); local_2a8 = local_2a8 + 1) {
              Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18),
                           (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
              pfVar5 = Mat::row(&local_2f0,local_294);
              in_stack_fffffffffffffb6c = pfVar5[local_298];
              Mat::~Mat((Mat *)0x1aecd5);
              if (local_2a4 < in_stack_fffffffffffffb6c) {
                local_2a0 = local_2a8;
                local_2a4 = in_stack_fffffffffffffb6c;
              }
              local_2ac = in_stack_fffffffffffffb6c;
            }
            in_stack_fffffffffffffb68 = sigmoid(0.0);
            local_2f4 = local_29c * in_stack_fffffffffffffb68;
            local_2a4 = in_stack_fffffffffffffb68;
            if (*(float *)(in_RDI + 0xc0) <= local_2f4) {
              in_stack_fffffffffffffb60 = (float)local_298;
              in_stack_fffffffffffffb64 = sigmoid(0.0);
              local_2f8 = (in_stack_fffffffffffffb60 + in_stack_fffffffffffffb64) / (float)local_ac;
              in_stack_fffffffffffffb58 = (float)local_294;
              in_stack_fffffffffffffb5c = sigmoid(0.0);
              local_2fc = (in_stack_fffffffffffffb58 + in_stack_fffffffffffffb5c) / (float)local_b0;
              dVar10 = std::exp((double)(ulong)(uint)*local_180);
              in_stack_fffffffffffffb54 = SUB84(dVar10,0);
              local_300 = (in_stack_fffffffffffffb54 * local_e0) / (float)local_cc;
              dVar10 = std::exp((double)(ulong)(uint)*local_1c8);
              in_stack_fffffffffffffb50 = SUB84(dVar10,0);
              local_304 = (in_stack_fffffffffffffb50 * local_e4) / (float)local_d0;
              local_328 = local_2f8 - local_300 * 0.5;
              local_324 = local_2fc - local_304 * 0.5;
              local_320 = local_2f8 + local_300 * 0.5;
              local_31c = local_2fc + local_304 * 0.5;
              local_318 = local_2a0;
              local_314 = local_31c;
              local_310 = local_320;
              local_30c = local_324;
              local_308 = local_328;
              std::
              vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              ::operator[](&local_78,(long)local_d4);
              std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                        ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                         in_stack_fffffffffffffb20,
                         (value_type *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18)
                        );
              std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::operator[](&local_90,(long)local_d4);
              std::vector<float,_std::allocator<float>_>::push_back
                        (in_stack_fffffffffffffb20,
                         (value_type_conflict4 *)
                         CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
            }
            local_f0 = local_f0 + 1;
            local_138 = local_138 + 1;
            local_180 = local_180 + 1;
            local_1c8 = local_1c8 + 1;
            local_210 = local_210 + 1;
          }
        }
        Mat::~Mat((Mat *)0x1af18c);
      }
      for (local_32c = 0; local_32c < *(int *)(in_RDI + 0xbc); local_32c = local_32c + 1) {
        local_338 = std::
                    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                    ::operator[](&local_78,(long)local_32c);
        local_340 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[](&local_90,(long)local_32c);
        local_350 = (BBoxRect *)
                    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                               in_stack_fffffffffffffb08);
        __gnu_cxx::
        __normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>
        ::__normal_iterator<ncnn::BBoxRect*>
                  ((__normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                    *)in_stack_fffffffffffffb10,
                   (__normal_iterator<ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                    *)in_stack_fffffffffffffb08);
        local_358 = (BBoxRect *)
                    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::begin
                              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                               in_stack_fffffffffffffb08);
        local_360 = (BBoxRect *)
                    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                               in_stack_fffffffffffffb08);
        __position._M_current._4_4_ = in_stack_fffffffffffffb6c;
        __position._M_current._0_4_ = in_stack_fffffffffffffb68;
        __first._M_current._4_4_ = in_stack_fffffffffffffb64;
        __first._M_current._0_4_ = in_stack_fffffffffffffb60;
        __last._M_current._4_4_ = in_stack_fffffffffffffb5c;
        __last._M_current._0_4_ = in_stack_fffffffffffffb58;
        local_368 = (BBoxRect *)
                    std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                    insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                               CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                               __position,__first,__last);
        in_stack_fffffffffffffb30 = (Mat *)local_58;
        local_378 = (float *)std::vector<float,_std::allocator<float>_>::end
                                       (in_stack_fffffffffffffb08);
        __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
        __normal_iterator<float*>
                  ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   in_stack_fffffffffffffb10,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   in_stack_fffffffffffffb08);
        local_380 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                       (in_stack_fffffffffffffb08);
        local_388 = (float *)std::vector<float,_std::allocator<float>_>::end
                                       (in_stack_fffffffffffffb08);
        __position_00._M_current._4_4_ = in_stack_fffffffffffffb6c;
        __position_00._M_current._0_4_ = in_stack_fffffffffffffb68;
        __first_00._M_current._4_4_ = in_stack_fffffffffffffb64;
        __first_00._M_current._0_4_ = in_stack_fffffffffffffb60;
        __last_00._M_current._4_4_ = in_stack_fffffffffffffb5c;
        __last_00._M_current._0_4_ = in_stack_fffffffffffffb58;
        local_390 = (float *)std::vector<float,std::allocator<float>>::
                             insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                                       ((vector<float,_std::allocator<float>_> *)
                                        CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50
                                                ),__position_00,__first_00,__last_00);
      }
      local_bc = 0;
    }
    else {
      local_4 = -1;
      local_bc = 1;
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_fffffffffffffb20);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)in_stack_fffffffffffffb20);
    if (local_bc != 0) goto LAB_001af77f;
    local_60 = local_60 + 1;
  }
  qsort_descent_inplace<ncnn::BBoxRect>
            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)in_stack_fffffffffffffb20,
             (vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  pvVar11 = &local_3a8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1af3e1);
  nms_sorted_bboxes(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,nms_threshold);
  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x1af412);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1af41f);
  local_3e0 = (vector<float,_std::allocator<float>_> *)0x0;
  while( true ) {
    in_stack_fffffffffffffb20 = local_3e0;
    pvVar6 = (vector<float,_std::allocator<float>_> *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_3a8);
    if (pvVar6 <= in_stack_fffffffffffffb20) break;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_3a8,(size_type)local_3e0);
    sVar4 = *pvVar7;
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)(local_58 + 0x18),sVar4);
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)in_stack_fffffffffffffb20,
               (value_type *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
    std::vector<float,_std::allocator<float>_>::operator[]
              ((vector<float,_std::allocator<float>_> *)local_58,sVar4);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_fffffffffffffb20,
               (value_type_conflict4 *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18)
              );
    local_3e0 = (vector<float,_std::allocator<float>_> *)
                ((long)&(((_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                         &local_3e0->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                        super__Vector_impl_data._M_start + 1);
  }
  sVar4 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_3c0);
  if ((int)sVar4 == 0) {
    local_4 = 0;
  }
  else {
    this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffb30,(int)((ulong)pvVar11 >> 0x20),(int)pvVar11,
                (size_t)in_stack_fffffffffffffb20,
                (Allocator *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
    bVar3 = Mat::empty(in_stack_fffffffffffffb10);
    if (bVar3) {
      local_4 = -100;
    }
    else {
      for (local_3fc = 0; local_3fc < (int)sVar4; local_3fc = local_3fc + 1) {
        pvVar8 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                           (&local_3c0,(long)local_3fc);
        pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&local_3d8,(long)local_3fc);
        vVar1 = *pvVar9;
        pfVar5 = Mat::row(this_00,local_3fc);
        *pfVar5 = (float)(pvVar8->label + 1);
        pfVar5[1] = vVar1;
        pfVar5[2] = pvVar8->xmin;
        pfVar5[3] = pvVar8->ymin;
        pfVar5[4] = pvVar8->xmax;
        pfVar5[5] = pvVar8->ymax;
      }
      local_4 = 0;
    }
  }
  local_bc = 1;
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffb20);
  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)in_stack_fffffffffffffb20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb20);
LAB_001af77f:
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffb20);
  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)in_stack_fffffffffffffb20);
  return local_4;
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector< std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector< std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
#pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {


                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -std::numeric_limits<float>::max();
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
                    class_score = sigmoid(class_score);

                    //printf( "%d %f %f\n", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                                            // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;
                        
                        BBoxRect c = { bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index };
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }



        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }

    }
    

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1);// +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}